

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O1

Abc_Cex_t * Abc_CexMerge(Abc_Cex_t *pCex,Abc_Cex_t *pPart,int iFrBeg,int iFrEnd)

{
  size_t __size;
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Abc_Cex_t *__s;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  uint uVar11;
  bool bVar12;
  
  if (iFrBeg < 0) {
    pcVar10 = "Starting frame is less than 0.";
  }
  else {
    if (-1 < iFrEnd) {
      iVar1 = pCex->iFrame;
      if (iVar1 < iFrBeg) {
        pcVar10 = "Starting frame is more than the last frame of CEX (%d).\n";
      }
      else {
        if (iFrEnd <= iVar1) {
          if (iFrEnd < iFrBeg) {
            printf("Starting frame (%d) should be less than stopping frame (%d).\n",
                   (ulong)(uint)iFrBeg,(ulong)(uint)iFrEnd);
            return (Abc_Cex_t *)0x0;
          }
          iVar2 = pCex->nPis;
          if (iVar2 != pPart->nPis) {
            __assert_fail("pCex->nPis == pPart->nPis",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilCex.c"
                          ,0xd9,"Abc_Cex_t *Abc_CexMerge(Abc_Cex_t *, Abc_Cex_t *, int, int)");
          }
          iVar3 = (iFrEnd - iFrBeg) + pPart->iPo;
          iVar6 = pPart->iFrame;
          if (iVar3 < iVar6) {
            __assert_fail("iFrEnd - iFrBeg + pPart->iPo >= pPart->iFrame",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilCex.c"
                          ,0xda,"Abc_Cex_t *Abc_CexMerge(Abc_Cex_t *, Abc_Cex_t *, int, int)");
          }
          uVar11 = pCex->nRegs;
          iVar3 = iVar6 - iVar3;
          uVar5 = (iVar3 + iVar1 + 1) * iVar2 + uVar11;
          __size = (long)(int)((((int)uVar5 >> 5) + 1) - (uint)((uVar5 & 0x1f) == 0)) * 4 + 0x14;
          __s = (Abc_Cex_t *)malloc(__size);
          memset(__s,0,__size);
          __s->nRegs = uVar11;
          __s->nPis = iVar2;
          __s->nBits = uVar5;
          __s->iPo = pCex->iPo;
          __s->iFrame = iVar3 + iVar1;
          uVar5 = 0;
          if (0 < (int)uVar11) {
            uVar4 = 0;
            do {
              if (((uint)(&pCex[1].iPo)[uVar4 >> 5] >> (uVar4 & 0x1f) & 1) != 0) {
                (&__s[1].iPo)[uVar4 >> 5] = (&__s[1].iPo)[uVar4 >> 5] | 1 << (sbyte)(uVar4 & 0x1f);
              }
              uVar4 = uVar4 + 1;
              uVar5 = uVar11;
            } while (uVar11 != uVar4);
          }
          if (iFrBeg != 0) {
            if (iFrBeg < 2) {
              iFrBeg = 1;
            }
            iVar3 = 0;
            uVar4 = uVar11;
            do {
              iVar8 = iVar2;
              uVar7 = uVar4;
              if (0 < iVar2) {
                do {
                  if (((uint)(&pCex[1].iPo)[(int)uVar7 >> 5] >> (uVar7 & 0x1f) & 1) != 0) {
                    (&__s[1].iPo)[(int)uVar5 >> 5] =
                         (&__s[1].iPo)[(int)uVar5 >> 5] | 1 << ((byte)uVar5 & 0x1f);
                  }
                  uVar5 = uVar5 + 1;
                  uVar7 = uVar7 + 1;
                  iVar8 = iVar8 + -1;
                } while (iVar8 != 0);
              }
              iVar3 = iVar3 + 1;
              uVar4 = uVar4 + iVar2;
            } while (iVar3 != iFrBeg);
          }
          if (0 < iVar6) {
            iVar3 = 0;
            iVar8 = 0;
            do {
              if (0 < iVar2) {
                uVar4 = pPart->nRegs + iVar3;
                iVar9 = iVar2;
                do {
                  if (((uint)(&pPart[1].iPo)[(int)uVar4 >> 5] >> (uVar4 & 0x1f) & 1) != 0) {
                    (&__s[1].iPo)[(int)uVar5 >> 5] =
                         (&__s[1].iPo)[(int)uVar5 >> 5] | 1 << ((byte)uVar5 & 0x1f);
                  }
                  uVar5 = uVar5 + 1;
                  uVar4 = uVar4 + 1;
                  iVar9 = iVar9 + -1;
                } while (iVar9 != 0);
              }
              iVar8 = iVar8 + 1;
              iVar3 = iVar3 + iVar2;
            } while (iVar8 != iVar6);
          }
          if (iFrEnd <= iVar1) {
            uVar11 = uVar11 + iVar2 * iFrEnd;
            do {
              iVar6 = iVar2;
              uVar4 = uVar11;
              if (0 < iVar2) {
                do {
                  if (((uint)(&pCex[1].iPo)[(int)uVar4 >> 5] >> (uVar4 & 0x1f) & 1) != 0) {
                    (&__s[1].iPo)[(int)uVar5 >> 5] =
                         (&__s[1].iPo)[(int)uVar5 >> 5] | 1 << ((byte)uVar5 & 0x1f);
                  }
                  uVar5 = uVar5 + 1;
                  iVar6 = iVar6 + -1;
                  uVar4 = uVar4 + 1;
                } while (iVar6 != 0);
              }
              uVar11 = uVar11 + iVar2;
              bVar12 = iFrEnd != iVar1;
              iFrEnd = iFrEnd + 1;
            } while (bVar12);
          }
          if (uVar5 == __s->nBits) {
            return __s;
          }
          __assert_fail("iBit == pNew->nBits",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilCex.c"
                        ,0xf0,"Abc_Cex_t *Abc_CexMerge(Abc_Cex_t *, Abc_Cex_t *, int, int)");
        }
        pcVar10 = "Stopping frame is more than the last frame of CEX (%d).\n";
      }
      printf(pcVar10);
      return (Abc_Cex_t *)0x0;
    }
    pcVar10 = "Stopping frame is less than 0.";
  }
  puts(pcVar10);
  return (Abc_Cex_t *)0x0;
}

Assistant:

Abc_Cex_t * Abc_CexMerge( Abc_Cex_t * pCex, Abc_Cex_t * pPart, int iFrBeg, int iFrEnd )
{
    Abc_Cex_t * pNew;
    int nFramesGain;
    int i, f, iBit;

    if ( iFrBeg < 0 )
        { printf( "Starting frame is less than 0.\n" ); return NULL; }
    if ( iFrEnd < 0 )
        { printf( "Stopping frame is less than 0.\n" ); return NULL; }
    if ( iFrBeg > pCex->iFrame )
        { printf( "Starting frame is more than the last frame of CEX (%d).\n", pCex->iFrame ); return NULL; }
    if ( iFrEnd > pCex->iFrame )
        { printf( "Stopping frame is more than the last frame of CEX (%d).\n", pCex->iFrame ); return NULL; }
    if ( iFrBeg > iFrEnd )
        { printf( "Starting frame (%d) should be less than stopping frame (%d).\n", iFrBeg, iFrEnd ); return NULL; }
    assert( iFrBeg >= 0 && iFrBeg <= pCex->iFrame );
    assert( iFrEnd >= 0 && iFrEnd <= pCex->iFrame );
    assert( iFrBeg <= iFrEnd );

    assert( pCex->nPis == pPart->nPis );
    assert( iFrEnd - iFrBeg + pPart->iPo >= pPart->iFrame );

    nFramesGain = iFrEnd - iFrBeg + pPart->iPo - pPart->iFrame;
    pNew = Abc_CexAlloc( pCex->nRegs, pCex->nPis, pCex->iFrame + 1 - nFramesGain );
    pNew->iPo    = pCex->iPo;
    pNew->iFrame = pCex->iFrame - nFramesGain;

    for ( iBit = 0; iBit < pCex->nRegs; iBit++ )
        if ( Abc_InfoHasBit(pCex->pData, iBit) )
            Abc_InfoSetBit( pNew->pData, iBit );
    for ( f = 0; f < iFrBeg; f++ )
        for ( i = 0; i < pCex->nPis; i++, iBit++ )
            if ( Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i) )
                Abc_InfoSetBit( pNew->pData, iBit );
    for ( f = 0; f < pPart->iFrame; f++ )
        for ( i = 0; i < pCex->nPis; i++, iBit++ )
            if ( Abc_InfoHasBit(pPart->pData, pPart->nRegs + pCex->nPis * f + i) )
                Abc_InfoSetBit( pNew->pData, iBit );
    for ( f = iFrEnd; f <= pCex->iFrame; f++ )
        for ( i = 0; i < pCex->nPis; i++, iBit++ )
            if ( Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i) )
                Abc_InfoSetBit( pNew->pData, iBit );
    assert( iBit == pNew->nBits );

    return pNew;
}